

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBAnalyzerResults.cpp
# Opt level: O3

string * GetInputData_abi_cxx11_(string *__return_storage_ptr__,U8 data1,U8 data2)

{
  char cVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  cVar1 = (char)__return_storage_ptr__;
  std::__cxx11::string::push_back(cVar1);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::push_back(cVar1);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::push_back(cVar1);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::push_back(cVar1);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::push_back(cVar1);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::push_back(cVar1);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::push_back(cVar1);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string GetInputData( U8 data1, U8 data2 )
{
    std::string retVal;

    retVal += data1 & 0x01 ? "Constant" : "Data";
    retVal += ',';
    retVal += data1 & 0x02 ? "Variable" : "Array";
    retVal += ',';
    retVal += data1 & 0x04 ? "Relative" : "Absolute";
    retVal += ',';
    retVal += data1 & 0x08 ? "Wrap" : "No wrap";
    retVal += ',';
    retVal += data1 & 0x10 ? "Non Linear" : "Linear";
    retVal += ',';
    retVal += data1 & 0x20 ? "No Preferred" : "Preferred State";
    retVal += ',';
    retVal += data1 & 0x40 ? "Null State" : "No Null position";
    retVal += ',';

    retVal += data2 & 0x01 ? "Buffered Bytes" : "Bit Field";

    return retVal;
}